

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O0

int hash_byte_sequence(uint8_t *bytes,size_t bytes_len,uint8_t alg_suite_id,uchar **hash_result)

{
  uchar *puVar1;
  long in_FS_OFFSET;
  uchar **hash_result_local;
  uint8_t alg_suite_id_local;
  size_t bytes_len_local;
  uint8_t *bytes_local;
  undefined1 local_80 [8];
  SHA256_CTX ctx;
  
  ctx._104_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  if (alg_suite_id == '\x01') {
    puVar1 = (uchar *)lrtr_malloc(0x20);
    *hash_result = puVar1;
    if (*hash_result == (uchar *)0x0) {
      bytes_local._4_4_ = -1;
    }
    else {
      SHA256_Init((SHA256_CTX *)local_80);
      SHA256_Update((SHA256_CTX *)local_80,bytes,bytes_len);
      SHA256_Final(*hash_result,(SHA256_CTX *)local_80);
      if (*hash_result == (uchar *)0x0) {
        bytes_local._4_4_ = -1;
      }
      else {
        bytes_local._4_4_ = 0;
      }
    }
  }
  else {
    bytes_local._4_4_ = -6;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == ctx._104_8_) {
    return bytes_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

int hash_byte_sequence(uint8_t *bytes, size_t bytes_len, uint8_t alg_suite_id, unsigned char **hash_result)
{
	if (alg_suite_id == RTR_BGPSEC_ALGORITHM_SUITE_1) {
		SHA256_CTX ctx;

		*hash_result = lrtr_malloc(SHA256_DIGEST_LENGTH);
		if (!*hash_result)
			return RTR_BGPSEC_ERROR;

		SHA256_Init(&ctx);
		SHA256_Update(&ctx, (const unsigned char *)bytes, bytes_len);
		SHA256_Final(*hash_result, &ctx);

		if (!*hash_result)
			return RTR_BGPSEC_ERROR;
	} else {
		return RTR_BGPSEC_UNSUPPORTED_ALGORITHM_SUITE;
	}

	return RTR_BGPSEC_SUCCESS;
}